

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.hh
# Opt level: O2

void __thiscall Pl_AES_PDF::~Pl_AES_PDF(Pl_AES_PDF *this)

{
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&this->key);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_AES_PDF() final = default;